

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MissingPropertyTypeHandler.cpp
# Opt level: O0

void Js::MissingPropertyTypeHandler::SetUndefinedPropertySlot(DynamicObject *instance)

{
  JavascriptLibrary *this;
  RecyclableObject *ptr;
  Type *slots;
  DynamicObject *instance_local;
  
  this = RecyclableObject::GetLibrary(&instance->super_RecyclableObject);
  ptr = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  Memory::WriteBarrierPtr<void>::operator=((WriteBarrierPtr<void> *)(instance + 1),ptr);
  return;
}

Assistant:

void MissingPropertyTypeHandler::SetUndefinedPropertySlot(DynamicObject* instance)
    {
        Field(Var)* slots = reinterpret_cast<Field(Var)*>(reinterpret_cast<size_t>(instance) + sizeof(DynamicObject));
        slots[0] = instance->GetLibrary()->GetUndefined();
    }